

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O2

void dukglue_read<std::vector<int,std::allocator<int>>>
               (duk_context *ctx,duk_idx_t arg_idx,vector<int,_std::allocator<int>_> *out)

{
  duk_idx_t in_ECX;
  _Vector_base<int,_std::allocator<int>_> _Stack_28;
  
  dukglue::types::DukType<std::vector<int,std::allocator<int>>>::
  read<std::vector<int,std::allocator<int>>>
            ((vector<int,_std::allocator<int>_> *)&_Stack_28,
             (DukType<std::vector<int,std::allocator<int>>> *)ctx,
             (duk_context *)(ulong)(uint)arg_idx,in_ECX);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(out,&_Stack_28);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

void dukglue_read(duk_context* ctx, duk_idx_t arg_idx, RetT* out)
{
	// ArgStorage has some static_asserts in it that validate value types,
	// so we typedef it to force ArgStorage<RetType> to compile and run the asserts
	typedef typename dukglue::types::ArgStorage<RetT>::type ValidateReturnType;

	using namespace dukglue::types;
	*out = DukType<typename Bare<RetT>::type>::template read<RetT>(ctx, arg_idx);
}